

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_app.h
# Opt level: O1

void sapp_set_icon(sapp_icon_desc *desc)

{
  char cVar1;
  undefined4 uVar2;
  size_t sVar3;
  void *pvVar4;
  sapp_icon_desc *psVar5;
  sapp_image_desc *psVar6;
  wchar_t img_index;
  ulong uVar7;
  uint32_t *puVar8;
  ulong uVar9;
  long *__ptr;
  int iVar10;
  long *plVar11;
  size_t *psVar12;
  long lVar13;
  int *piVar14;
  undefined4 uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  char cVar23;
  wchar_t x;
  int *piVar24;
  bool bVar25;
  bool bVar26;
  
  if (desc == (sapp_icon_desc *)0x0) {
    __assert_fail("desc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_app.h"
                  ,0x2f4b,"void sapp_set_icon(const sapp_icon_desc *)");
  }
  if (desc->sokol_default == true) {
    if (_sapp.default_icon_pixels == (uint32_t *)0x0) {
      puVar8 = (uint32_t *)_sapp_malloc_clear(0x5400);
      psVar12 = &_sapp.default_icon_desc.images[0].pixels.size;
      lVar17 = 0;
      lVar18 = 0;
      _sapp.default_icon_pixels = puVar8;
      do {
        iVar22 = *(int *)((long)&DAT_001a24d0 + lVar17);
        *(int *)(psVar12 + -2) = iVar22;
        *(int *)((long)psVar12 + -0xc) = iVar22;
        ((sapp_range *)(psVar12 + -1))->ptr = (void *)((long)puVar8 + lVar18);
        *psVar12 = (ulong)(uint)(iVar22 * iVar22) * 4;
        lVar18 = lVar18 + (ulong)(uint)(iVar22 * iVar22) * 4;
        lVar17 = lVar17 + 4;
        psVar12 = psVar12 + 3;
      } while (lVar17 != 0xc);
      lVar18 = 0;
      lVar17 = 0;
      do {
        iVar22 = (&DAT_001a24d0)[lVar18];
        iVar10 = iVar22 + 7;
        if (-1 < iVar22) {
          iVar10 = iVar22;
        }
        iVar10 = iVar10 >> 3;
        if (iVar10 < 2) {
          iVar10 = 1;
        }
        lVar13 = 0;
        do {
          uVar2 = (&DAT_001a9650)[lVar13];
          cVar1 = (&DAT_001a5388)[lVar13];
          iVar22 = 0;
          do {
            iVar21 = 0;
            cVar23 = cVar1;
            do {
              iVar20 = iVar10;
              uVar15 = uVar2;
              if (-1 < cVar23) {
                uVar15 = 0xffffff;
              }
              do {
                if (0x53ff < lVar17) {
                  __assert_fail("dst < dst_end",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_app.h"
                                ,0xc3a,"void _sapp_setup_default_icon(void)");
                }
                *(undefined4 *)((long)puVar8 + lVar17) = uVar15;
                lVar17 = lVar17 + 4;
                iVar20 = iVar20 + -1;
              } while (iVar20 != 0);
              iVar21 = iVar21 + 1;
              cVar23 = cVar23 * '\x02';
            } while (iVar21 != 8);
            iVar22 = iVar22 + 1;
          } while (iVar22 != iVar10);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 8);
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
      if (lVar17 != 0x5400) {
        __assert_fail("dst == dst_end",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_app.h"
                      ,0xc41,"void _sapp_setup_default_icon(void)");
      }
      lVar17 = 0;
      lVar18 = 0;
      do {
        uVar16 = (&DAT_001a24d0)[lVar17];
        uVar7 = 1;
        if (1 < (int)uVar16) {
          uVar7 = (ulong)uVar16;
        }
        lVar13 = (long)puVar8 + lVar18;
        uVar9 = 0;
        do {
          uVar19 = 0;
          iVar22 = 0xffffff;
          do {
            iVar10 = *(int *)(lVar13 + uVar19 * 4);
            if (iVar22 != 0xffffff && iVar10 == 0xffffff) {
              *(undefined4 *)(lVar13 + uVar19 * 4) = 0xff000000;
            }
            uVar19 = uVar19 + 1;
            iVar22 = iVar10;
          } while (uVar7 != uVar19);
          uVar9 = uVar9 + 1;
          lVar13 = lVar13 + (long)(int)uVar16 * 4;
        } while (uVar9 != uVar7);
        lVar18 = lVar18 + (ulong)(uVar16 * uVar16) * 4;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      lVar17 = 0;
      lVar18 = 0;
      do {
        uVar16 = (&DAT_001a24d0)[lVar17];
        uVar7 = 1;
        if (1 < (int)uVar16) {
          uVar7 = (ulong)uVar16;
        }
        piVar14 = (int *)((long)puVar8 + lVar18);
        uVar9 = 0;
        do {
          piVar24 = piVar14;
          uVar19 = uVar7;
          iVar22 = 0xffffff;
          do {
            iVar10 = *piVar24;
            if (iVar22 != 0xffffff && iVar10 == 0xffffff) {
              *piVar24 = -0x1000000;
            }
            piVar24 = piVar24 + (int)uVar16;
            uVar19 = uVar19 - 1;
            iVar22 = iVar10;
          } while (uVar19 != 0);
          uVar9 = uVar9 + 1;
          piVar14 = piVar14 + 1;
        } while (uVar9 != uVar7);
        lVar18 = lVar18 + (ulong)(uVar16 * uVar16) * 4;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
    }
    if (_sapp.default_icon_pixels == (uint32_t *)0x0) {
      __assert_fail("0 != _sapp.default_icon_pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_app.h"
                    ,0x2f50,"void sapp_set_icon(const sapp_icon_desc *)");
    }
    desc = &_sapp.default_icon_desc;
  }
  psVar6 = desc->images;
  uVar7 = 0;
  do {
    if ((psVar6->pixels).ptr == (void *)0x0) goto LAB_0010c045;
    uVar7 = uVar7 + 1;
    psVar6 = (sapp_image_desc *)(&psVar6->pixels + 1);
  } while (uVar7 != 8);
  uVar7 = 8;
LAB_0010c045:
  if ((uint)uVar7 != 0) {
    if (8 < (uint)uVar7) {
      __assert_fail("(num_images > 0) && (num_images <= SAPP_MAX_ICONIMAGES)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_app.h"
                    ,0x2f57,"void sapp_set_icon(const sapp_icon_desc *)");
    }
    uVar7 = uVar7 & 0xffffffff;
    bVar25 = false;
    uVar9 = 1;
    psVar5 = desc;
    do {
      psVar12 = &psVar5->images[0].pixels.size;
      iVar22 = psVar5->images[0].width;
      if (iVar22 < 1) {
        __assert_fail("desc->width > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_app.h"
                      ,0xbc8,"_Bool _sapp_image_validate(const sapp_image_desc *)");
      }
      iVar10 = psVar5->images[0].height;
      if (iVar10 < 1) {
        __assert_fail("desc->height > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_app.h"
                      ,0xbc9,"_Bool _sapp_image_validate(const sapp_image_desc *)");
      }
      if (psVar5->images[0].pixels.ptr == (void *)0x0) {
        __assert_fail("desc->pixels.ptr != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_app.h"
                      ,0xbca,"_Bool _sapp_image_validate(const sapp_image_desc *)");
      }
      sVar3 = *psVar12;
      if (sVar3 == 0) {
        __assert_fail("desc->pixels.size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_app.h"
                      ,0xbcb,"_Bool _sapp_image_validate(const sapp_image_desc *)");
      }
      if ((ulong)(uint)(iVar10 * iVar22) << 2 != sVar3) {
        if (_sapp.desc.logger.log_cb == (_func_void_char_ptr_void_ptr *)0x0) {
          puts("Image data size mismatch (must be width*height*4 bytes)\n");
        }
        else {
          (*_sapp.desc.logger.log_cb)
                    ("Image data size mismatch (must be width*height*4 bytes)\n",
                     _sapp.desc.logger.user_data);
        }
        break;
      }
      bVar25 = uVar7 <= uVar9;
      bVar26 = uVar9 != uVar7;
      uVar9 = uVar9 + 1;
      psVar5 = (sapp_icon_desc *)psVar12;
    } while (bVar26);
    if (bVar25) {
      piVar14 = &desc->images[0].height;
      iVar22 = 0;
      uVar9 = uVar7;
      do {
        iVar22 = iVar22 + *piVar14 * ((sapp_image_desc *)(piVar14 + -1))->width + 2;
        piVar14 = piVar14 + 6;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
      __ptr = (long *)_sapp_malloc_clear((long)iVar22 << 3);
      uVar9 = 0;
      plVar11 = __ptr;
      do {
        pvVar4 = desc->images[uVar9].pixels.ptr;
        iVar10 = desc->images[uVar9].width;
        *plVar11 = (long)iVar10;
        iVar21 = desc->images[uVar9].height;
        plVar11[1] = (long)iVar21;
        plVar11 = plVar11 + 2;
        uVar16 = iVar21 * iVar10;
        if (0 < (int)uVar16) {
          lVar18 = 0;
          uVar19 = 0;
          do {
            plVar11[uVar19] =
                 (ulong)*(byte *)((long)pvVar4 + uVar19 * 4 + 3) << 0x18 |
                 (ulong)*(byte *)((long)pvVar4 + uVar19 * 4 + 2) |
                 (ulong)((uint)*(byte *)((long)pvVar4 + uVar19 * 4 + 1) << 8 |
                        (uint)*(byte *)((long)pvVar4 + uVar19 * 4) << 0x10);
            uVar19 = uVar19 + 1;
            lVar18 = lVar18 + -8;
          } while (uVar16 != uVar19);
          plVar11 = (long *)((long)plVar11 - lVar18);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar7);
      XChangeProperty(_sapp.x11.display,_sapp.x11.window,_sapp.x11.NET_WM_ICON,6,0x20,0,__ptr,iVar22
                     );
      if (_sapp.desc.allocator.free == (_func_void_void_ptr_void_ptr *)0x0) {
        free(__ptr);
      }
      else {
        (*_sapp.desc.allocator.free)(__ptr,_sapp.desc.allocator.user_data);
      }
      XFlush(_sapp.x11.display);
      return;
    }
  }
  return;
}

Assistant:

SOKOL_API_IMPL void sapp_set_icon(const sapp_icon_desc* desc) {
    SOKOL_ASSERT(desc);
    if (desc->sokol_default) {
        if (0 == _sapp.default_icon_pixels) {
            _sapp_setup_default_icon();
        }
        SOKOL_ASSERT(0 != _sapp.default_icon_pixels);
        desc = &_sapp.default_icon_desc;
    }
    const int num_images = _sapp_icon_num_images(desc);
    if (num_images == 0) {
        return;
    }
    SOKOL_ASSERT((num_images > 0) && (num_images <= SAPP_MAX_ICONIMAGES));
    if (!_sapp_validate_icon_desc(desc, num_images)) {
        return;
    }
    #if defined(_SAPP_MACOS)
        _sapp_macos_set_icon(desc, num_images);
    #elif defined(_SAPP_WIN32)
        _sapp_win32_set_icon(desc, num_images);
    #elif defined(_SAPP_LINUX)
        _sapp_x11_set_icon(desc, num_images);
    #elif defined(_SAPP_EMSCRIPTEN)
        _sapp_emsc_set_icon(desc, num_images);
    #endif
}